

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uchar local_36 [8];
  char str [14];
  uchar digest [16];
  int local_10;
  int ret;
  int i;
  
  builtin_memcpy(local_36,"Hello, w",8);
  builtin_strncpy(str,"orld!",6);
  printf("\n  MD5(\'%s\') = ",local_36);
  iVar1 = mbedtls_md5_ret(local_36,0xd,(uchar *)(str + 6));
  if (iVar1 == 0) {
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      printf("%02x",(ulong)(byte)str[(long)local_10 + 6]);
    }
    printf("\n\n");
    ret = 0;
  }
  else {
    ret = 1;
  }
  return ret;
}

Assistant:

int main( void )
{
    int i, ret;
    unsigned char digest[16];
    char str[] = "Hello, world!";

    mbedtls_printf( "\n  MD5('%s') = ", str );

    if( ( ret = mbedtls_md5_ret( (unsigned char *) str, 13, digest ) ) != 0 )
        return( MBEDTLS_EXIT_FAILURE );

    for( i = 0; i < 16; i++ )
        mbedtls_printf( "%02x", digest[i] );

    mbedtls_printf( "\n\n" );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( MBEDTLS_EXIT_SUCCESS );
}